

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QGraphicsTransform*>::emplace<QGraphicsTransform*&>
          (QPodArrayOps<QGraphicsTransform_*> *this,qsizetype i,QGraphicsTransform **args)

{
  undefined1 uVar1;
  qsizetype qVar2;
  QGraphicsTransform **ppQVar3;
  undefined8 *in_RDX;
  long in_RSI;
  QArrayDataPointer<QGraphicsTransform_*> *in_RDI;
  QGraphicsTransform **where;
  GrowthPosition pos;
  QGraphicsTransform *tmp;
  bool detach;
  QArrayDataPointer<QGraphicsTransform_*> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar4;
  QGraphicsTransform *pQVar5;
  undefined7 in_stack_ffffffffffffffe0;
  
  uVar1 = QArrayDataPointer<QGraphicsTransform_*>::needsDetach(in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->size) &&
       (qVar2 = QArrayDataPointer<QGraphicsTransform_*>::freeSpaceAtEnd(in_stack_ffffffffffffffc8),
       qVar2 != 0)) {
      ppQVar3 = QArrayDataPointer<QGraphicsTransform_*>::end(in_RDI);
      *ppQVar3 = (QGraphicsTransform *)*in_RDX;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
    if ((in_RSI == 0) &&
       (qVar2 = QArrayDataPointer<QGraphicsTransform_*>::freeSpaceAtBegin(in_stack_ffffffffffffffc8)
       , qVar2 != 0)) {
      ppQVar3 = QArrayDataPointer<QGraphicsTransform_*>::begin
                          ((QArrayDataPointer<QGraphicsTransform_*> *)0x9a6887);
      ppQVar3[-1] = (QGraphicsTransform *)*in_RDX;
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      return;
    }
  }
  pQVar5 = (QGraphicsTransform *)*in_RDX;
  uVar4 = 0;
  if ((in_RDI->size != 0) && (in_RSI == 0)) {
    uVar4 = 1;
  }
  QArrayDataPointer<QGraphicsTransform_*>::detachAndGrow
            ((QArrayDataPointer<QGraphicsTransform_*> *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),
             (GrowthPosition)((ulong)pQVar5 >> 0x20),CONCAT44(uVar4,in_stack_ffffffffffffffd0),
             (QGraphicsTransform ***)in_stack_ffffffffffffffc8,in_RDI);
  ppQVar3 = QPodArrayOps<QGraphicsTransform_*>::createHole
                      ((QPodArrayOps<QGraphicsTransform_*> *)
                       CONCAT17(uVar1,in_stack_ffffffffffffffe0),
                       (GrowthPosition)((ulong)pQVar5 >> 0x20),
                       CONCAT44(uVar4,in_stack_ffffffffffffffd0),
                       (qsizetype)in_stack_ffffffffffffffc8);
  *ppQVar3 = pQVar5;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }